

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::~DefaultValueObjectWriter
          (DefaultValueObjectWriter *this)

{
  _Manager_type p_Var1;
  Node *pNVar2;
  
  (this->super_ObjectWriter)._vptr_ObjectWriter =
       (_func_int **)&PTR__DefaultValueObjectWriter_003c8b38;
  if ((this->own_typeinfo_ == true) && (this->typeinfo_ != (TypeInfo *)0x0)) {
    (*this->typeinfo_->_vptr_TypeInfo[1])();
  }
  p_Var1 = (this->field_scrub_callback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->field_scrub_callback_,(_Any_data *)&this->field_scrub_callback_,
              __destroy_functor);
  }
  std::
  _Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  ::~_Deque_base((_Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                  *)&this->stack_);
  pNVar2 = (this->root_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
           ._M_head_impl;
  if (pNVar2 != (Node *)0x0) {
    (*pNVar2->_vptr_Node[1])();
  }
  (this->root_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
  ._M_head_impl = (Node *)0x0;
  std::
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->string_values_);
  return;
}

Assistant:

DefaultValueObjectWriter::~DefaultValueObjectWriter() {
  if (own_typeinfo_) {
    delete typeinfo_;
  }
}